

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> *
cfd::core::RandomNumberUtil::GetRandomIndexes
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          uint32_t length)

{
  int iVar1;
  size_type sVar2;
  uint uVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *result;
  uniform_int_distribution<int> dist;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> exist_value;
  uint local_74;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_70;
  uniform_int_distribution<int> local_68;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_60;
  
  local_70 = __return_storage_ptr__;
  if ((GetRandomIndexes(unsigned_int)::rd == '\0') &&
     (iVar1 = __cxa_guard_acquire(&GetRandomIndexes(unsigned_int)::rd), iVar1 != 0)) {
    std::random_device::random_device(&GetRandomIndexes::rd);
    __cxa_atexit(std::random_device::~random_device,&GetRandomIndexes::rd,&__dso_handle);
    __cxa_guard_release(&GetRandomIndexes(unsigned_int)::rd);
  }
  if ((GetRandomIndexes(unsigned_int)::engine == '\0') &&
     (iVar1 = __cxa_guard_acquire(&GetRandomIndexes(unsigned_int)::engine), iVar1 != 0)) {
    uVar3 = ::std::random_device::_M_getval();
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::seed(&GetRandomIndexes::engine,(ulong)uVar3);
    __cxa_guard_release(&GetRandomIndexes(unsigned_int)::engine);
  }
  local_68._M_param._M_a = 0;
  local_68._M_param._M_b = length;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (local_70,(ulong)length,(allocator_type *)&local_60);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (length != 0) {
    if (length == 1) {
      *(local_70->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_start = 0;
    }
    else {
      uVar3 = 0;
      while (uVar3 < length - 1) {
        local_74 = ::std::uniform_int_distribution<int>::operator()
                             (&local_68,&GetRandomIndexes::engine);
        if (length <= local_74) {
          local_74 = local_74 / length;
        }
        if ((local_60._M_impl.super__Rb_tree_header._M_node_count == 0) ||
           (sVar2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                    count((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)&local_60,&local_74), sVar2 == 0)) {
          (local_70->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar3] = local_74;
          ::std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_insert_unique<unsigned_int_const&>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)&local_60,&local_74);
          uVar3 = uVar3 + 1;
        }
      }
      for (local_74 = 0; local_74 < length; local_74 = local_74 + 1) {
        sVar2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                count((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                      &local_60,&local_74);
        if (sVar2 == 0) {
          (local_70->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start[length - 1] = local_74;
          break;
        }
      }
    }
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_60);
  return local_70;
}

Assistant:

std::vector<uint32_t> RandomNumberUtil::GetRandomIndexes(uint32_t length) {
#if defined(_WIN32) && defined(__GNUC__) && (__GNUC__ < 9)
  // for mingw gcc lower 9
  static std::mt19937 engine(static_cast<unsigned int>(time(nullptr)));
#else
  static std::random_device rd;
  static std::mt19937 engine(rd());
#endif
  std::uniform_int_distribution<> dist(0, length);
  std::vector<uint32_t> result(length);
  std::set<uint32_t> exist_value;
  uint32_t value;

  if (length == 1) {
    result[0] = 0;
  } else if (length > 1) {
    uint32_t index = 0;
    while (index < (length - 1)) {
      value = dist(engine);
      if (value >= length) {
        value /= length;
      }
      if ((exist_value.empty()) || (exist_value.count(value) == 0)) {  // MSVC
        result[index] = value;
        exist_value.insert(value);
        ++index;
      }
    }

    for (value = 0; value < length; ++value) {
      if (exist_value.count(value) == 0) {
        result[length - 1] = value;
        break;
      }
    }
  }

  return result;
}